

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase28::run(TestCase28 *this)

{
  return;
}

Assistant:

TEST(Function, Lambda) {
  int i = 0;

  Function<int(int, int)> f = [&](int a, int b) { return a + b + i++; };

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9 + 2 + 2, f(2, 9));

  EXPECT_EQ(i, 3);
}